

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

void __thiscall duckdb_shell::ShellState::NewTempFile(ShellState *this,char *zSuffix)

{
  char *pcVar1;
  __buckets_ptr pp_Var2;
  char *in_RSI;
  sqlite3 *in_RDI;
  sqlite3_uint64 r;
  char *zTemp;
  ShellState *in_stack_ffffffffffffffe0;
  void *in_stack_ffffffffffffffe8;
  sqlite3 *psVar3;
  
  psVar3 = in_RDI;
  ClearTempFile(in_stack_ffffffffffffffe0);
  duckdb_shell_sqlite3_free((void *)0x1dcb49);
  (in_RDI->last_error).extra_info._M_h._M_buckets = (__buckets_ptr)0x0;
  if ((DuckDB *)
      (in_RDI->db).super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
      super___uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DuckDB_*,_std::default_delete<duckdb::DuckDB>_>.
      super__Head_base<0UL,_duckdb::DuckDB_*,_false> != (DuckDB *)0x0) {
    duckdb_shell_sqlite3_file_control
              (psVar3,in_RSI,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
               in_stack_ffffffffffffffe0);
  }
  if ((in_RDI->last_error).extra_info._M_h._M_buckets == (__buckets_ptr)0x0) {
    duckdb_shell_sqlite3_randomness((int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe8);
    pcVar1 = getenv("TEMP");
    if (pcVar1 == (char *)0x0) {
      pcVar1 = getenv("TMP");
    }
    if (pcVar1 == (char *)0x0) {
      pcVar1 = "/tmp";
    }
    pp_Var2 = (__buckets_ptr)
              duckdb_shell_sqlite3_mprintf("%s/temp%llx.%s",pcVar1,in_stack_ffffffffffffffe0,in_RSI)
    ;
    (in_RDI->last_error).extra_info._M_h._M_buckets = pp_Var2;
  }
  else {
    pp_Var2 = (__buckets_ptr)
              duckdb_shell_sqlite3_mprintf
                        ("%z.%s",(in_RDI->last_error).extra_info._M_h._M_buckets,in_RSI);
    (in_RDI->last_error).extra_info._M_h._M_buckets = pp_Var2;
  }
  if ((in_RDI->last_error).extra_info._M_h._M_buckets == (__buckets_ptr)0x0) {
    fprintf(_stderr,"out of memory\n");
    exit(1);
  }
  return;
}

Assistant:

void ShellState::NewTempFile(const char *zSuffix) {
	ClearTempFile();
	sqlite3_free(zTempFile);
	zTempFile = 0;
	if (db) {
		sqlite3_file_control(db, 0, SQLITE_FCNTL_TEMPFILENAME, &zTempFile);
	}
	if (zTempFile == 0) {
		/* If db is an in-memory database then the TEMPFILENAME file-control
		** will not work and we will need to fallback to guessing */
		const char *zTemp;
		sqlite3_uint64 r;
		sqlite3_randomness(sizeof(r), &r);
		zTemp = getenv("TEMP");
		if (zTemp == 0)
			zTemp = getenv("TMP");
		if (zTemp == 0) {
#ifdef _WIN32
			zTemp = "\\tmp";
#else
			zTemp = "/tmp";
#endif
		}
		zTempFile = sqlite3_mprintf("%s/temp%llx.%s", zTemp, r, zSuffix);
	} else {
		zTempFile = sqlite3_mprintf("%z.%s", zTempFile, zSuffix);
	}
	if (zTempFile == 0) {
		raw_printf(stderr, "out of memory\n");
		exit(1);
	}
}